

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateEnumDefinitions
          (MessageGenerator *this,Printer *printer)

{
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar1;
  Descriptor *pDVar2;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar3;
  char *__function;
  long lVar4;
  
  pDVar2 = this->descriptor_;
  if (0 < *(int *)(pDVar2 + 0x38)) {
    lVar4 = 0;
    do {
      psVar1 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->nested_generators_,lVar4);
      if (psVar1->ptr_ == (MessageGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->() const [C = google::protobuf::compiler::cpp::MessageGenerator]"
        ;
        goto LAB_0019289b;
      }
      GenerateEnumDefinitions(psVar1->ptr_,printer);
      lVar4 = lVar4 + 1;
      pDVar2 = this->descriptor_;
    } while (lVar4 < *(int *)(pDVar2 + 0x38));
  }
  if (0 < *(int *)(pDVar2 + 0x48)) {
    lVar4 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_,lVar4);
      if (psVar3->ptr_ == (EnumGenerator *)0x0) {
        __function = 
        "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->() const [C = google::protobuf::compiler::cpp::EnumGenerator]"
        ;
LAB_0019289b:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,__function);
      }
      EnumGenerator::GenerateDefinition(psVar3->ptr_,printer);
      lVar4 = lVar4 + 1;
    } while (lVar4 < *(int *)(this->descriptor_ + 0x48));
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateEnumDefinitions(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateEnumDefinitions(printer);
  }

  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateDefinition(printer);
  }
}